

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hand.cpp
# Opt level: O0

void __thiscall Hand::getFarthestFinger(Hand *this)

{
  bool bVar1;
  double dVar2;
  Point_<int> local_90;
  Point_<int> local_88;
  reference local_80;
  Finger *f;
  iterator __end1;
  iterator __begin1;
  vector<Finger,_std::allocator<Finger>_> *__range1;
  Finger ff;
  double dist;
  double farthest;
  Hand *this_local;
  
  dist = -1.0;
  Finger::Finger((Finger *)&__range1);
  __end1 = std::vector<Finger,_std::allocator<Finger>_>::begin(&this->fingers);
  f = (Finger *)std::vector<Finger,_std::allocator<Finger>_>::end(&this->fingers);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Finger_*,_std::vector<Finger,_std::allocator<Finger>_>_>
                                *)&f);
    if (!bVar1) break;
    local_80 = __gnu_cxx::__normal_iterator<Finger_*,_std::vector<Finger,_std::allocator<Finger>_>_>
               ::operator*(&__end1);
    cv::Point_<int>::Point_(&local_88,&local_80->ptStart);
    cv::Point_<int>::Point_(&local_90,&local_80->ptFar);
    dVar2 = getDist(&local_88,&local_90);
    ff.boundingBox._8_8_ = dVar2;
    if (dist < dVar2) {
      Finger::operator=((Finger *)&__range1,local_80);
      dist = dVar2;
    }
    __gnu_cxx::__normal_iterator<Finger_*,_std::vector<Finger,_std::allocator<Finger>_>_>::
    operator++(&__end1);
  }
  Finger::operator=(&this->farthestFinger,(Finger *)&__range1);
  return;
}

Assistant:

void Hand::getFarthestFinger() {
    double farthest = -1;
    double dist;
    Finger ff;
    for (Finger &f : fingers) {
        dist = getDist(f.ptStart, f.ptFar);
        if (dist > farthest) {
            farthest = dist;
            ff = f;
        }
    }
    farthestFinger = ff;
}